

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

ssize_t __thiscall gguf_writer::write(gguf_writer *this,int __fd,void *__buf,size_t __n)

{
  string *psVar1;
  gguf_type *pgVar2;
  gguf_kv *this_00;
  bool *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  uint *__n_00;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  undefined4 in_register_00000034;
  size_t i_1;
  size_t i;
  uint64_t ne;
  gguf_kv *in_stack_ffffffffffffffd0;
  gguf_kv *in_stack_ffffffffffffffd8;
  undefined4 local_1c;
  gguf_kv *local_18;
  gguf_kv *local_10;
  gguf_writer *local_8;
  
  local_10 = (gguf_kv *)CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  local_18 = (gguf_kv *)gguf_kv::get_ne(in_stack_ffffffffffffffd8);
  psVar1 = gguf_kv::get_key_abi_cxx11_(local_10);
  write(this,(int)psVar1,__buf_00,__n);
  if ((local_10->is_array & 1U) == 0) {
    pgVar2 = gguf_kv::get_type(local_10);
    write(this,(int)pgVar2,__buf_03,__n);
  }
  else {
    local_1c = 9;
    write(this,(int)&local_1c,__buf_01,__n);
    pgVar2 = gguf_kv::get_type(local_10);
    write(this,(int)pgVar2,__buf_02,__n);
    write<unsigned_long>((gguf_writer *)in_stack_ffffffffffffffd0,(unsigned_long *)this);
  }
  pgVar2 = gguf_kv::get_type(local_10);
  __n_00 = &switchD_001965ed::switchdataD_001c38d0;
  switch(*pgVar2) {
  case GGUF_TYPE_UINT8:
  case GGUF_TYPE_INT8:
  case GGUF_TYPE_UINT16:
  case GGUF_TYPE_INT16:
  case GGUF_TYPE_UINT32:
  case GGUF_TYPE_INT32:
  case GGUF_TYPE_FLOAT32:
  case GGUF_TYPE_UINT64:
  case GGUF_TYPE_INT64:
  case GGUF_TYPE_FLOAT64:
    this_00 = (gguf_kv *)write(this,(int)local_10 + 0x28,__buf_04,0x1c38d0);
    break;
  case GGUF_TYPE_BOOL:
    for (this_00 = (gguf_kv *)0x0; this_00 < local_18;
        this_00 = (gguf_kv *)&(this_00->key).field_0x1) {
      pbVar3 = gguf_kv::get_val<bool>(in_stack_ffffffffffffffd0,(size_t)this);
      write(this,(int)pbVar3,__buf_05,(size_t)__n_00);
    }
    break;
  case GGUF_TYPE_STRING:
    for (this_00 = (gguf_kv *)0x0; this_00 < local_18;
        this_00 = (gguf_kv *)&(this_00->key).field_0x1) {
      pbVar4 = gguf_kv::get_val<std::__cxx11::string>(this_00,(size_t)this);
      write(this,(int)pbVar4,__buf_06,(size_t)__n_00);
    }
    break;
  case GGUF_TYPE_ARRAY:
  default:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
               ,0x4c5,"invalid type");
  }
  return (ssize_t)this_00;
}

Assistant:

void write(const struct gguf_kv & kv) const {
        const uint64_t ne = kv.get_ne();

        write(kv.get_key());

        if (kv.is_array) {
            write(GGUF_TYPE_ARRAY);
            write(kv.get_type());
            write(ne);
        } else {
            write(kv.get_type());
        }

        switch (kv.get_type()) {
            case GGUF_TYPE_UINT8:
            case GGUF_TYPE_INT8:
            case GGUF_TYPE_UINT16:
            case GGUF_TYPE_INT16:
            case GGUF_TYPE_UINT32:
            case GGUF_TYPE_INT32:
            case GGUF_TYPE_FLOAT32:
            case GGUF_TYPE_UINT64:
            case GGUF_TYPE_INT64:
            case GGUF_TYPE_FLOAT64: {
                write(kv.data);
            } break;
            case GGUF_TYPE_BOOL: {
                for (size_t i = 0; i < ne; ++i) {
                    write(kv.get_val<bool>(i));
                }
            } break;
            case GGUF_TYPE_STRING: {
                for (size_t i = 0; i < ne; ++i) {
                    write(kv.get_val<std::string>(i));
                }
            } break;
            case GGUF_TYPE_ARRAY:
            default: GGML_ABORT("invalid type");
        }
    }